

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_postfix_expr(gvisitor_t *self,gnode_postfix_expr_t *node)

{
  _Bool _Var1;
  gnode_n gVar2;
  ulong *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  gnode_t **__ptr;
  int iVar6;
  gnode_t *pgVar7;
  int *piVar8;
  gnode_r *pgVar9;
  char *pcVar10;
  gnode_binary_expr_t *expr;
  ulong uVar11;
  ulong uVar12;
  gnode_postfix_subexpr_t *pgVar13;
  gnode_t *node_00;
  ulong uVar14;
  gnode_postfix_expr_t *node_01;
  ulong uVar15;
  gnode_postfix_expr_t *pgVar16;
  bool bVar17;
  bool bVar18;
  
  if (node->id == (gnode_t *)0x0) {
    pcVar10 = "Invalid postfix expression.";
  }
  else {
    gvisit(self,node->id);
    pgVar16 = (gnode_postfix_expr_t *)node->id;
    if (((pgVar16 == (gnode_postfix_expr_t *)0x0) || ((pgVar16->base).tag != NODE_IDENTIFIER_EXPR))
       || (pgVar7 = *(gnode_t **)&pgVar16[1].base, pgVar7 == (gnode_t *)0x0)) {
      node_00 = (gnode_t *)0x0;
    }
    else {
      node_00 = (gnode_t *)0x0;
      if (pgVar7->tag != NODE_VARIABLE) {
        node_00 = pgVar7;
      }
    }
    if ((node_00 == (gnode_t *)0x0) || (node_00->tag != NODE_ENUM_DECL)) {
      if ((pgVar16 != (gnode_postfix_expr_t *)0x0) && ((pgVar16->base).tag == NODE_IDENTIFIER_EXPR))
      {
        puVar3 = *self->data;
        if (puVar3 == (ulong *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15 = *puVar3;
        }
        if (1 < uVar15) {
          uVar12 = *puVar3;
          if (uVar15 - 1 < uVar12) {
            piVar8 = *(int **)((puVar3[2] - 8) + uVar15 * 8);
          }
          else {
            piVar8 = (int *)0x0;
          }
          if (((piVar8 != (int *)0x0) && (*piVar8 == 8)) &&
             (*(char **)(piVar8 + 0x18) != (char *)0x0)) {
            pgVar9 = node->list;
            iVar6 = strcmp(*(char **)(piVar8 + 0x18),"init");
            if (iVar6 == 0) {
              if (uVar15 - 2 < uVar12) {
                piVar8 = *(int **)((puVar3[2] - 0x10) + uVar15 * 8);
              }
              else {
                piVar8 = (int *)0x0;
              }
              if ((piVar8 != (int *)0x0) && (*piVar8 == 10)) {
                if (*(int **)&pgVar16[1].base == (int *)0x0) {
                  if (pgVar16->id == (gnode_t *)0x0) goto LAB_0011f807;
                  iVar6 = strcmp((char *)pgVar16->id,"self");
                  bVar17 = iVar6 == 0;
                }
                else {
                  bVar17 = piVar8 == *(int **)&pgVar16[1].base;
                }
                if (((pgVar9 != (gnode_r *)0x0) && (bVar17)) &&
                   ((pgVar9->n != 0 && ((*pgVar9->p)->tag == NODE_CALL_EXPR)))) {
                  report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                               "Infinite loop detected in init func.");
                }
              }
            }
          }
        }
      }
LAB_0011f807:
      pgVar7 = node->id;
      if ((pgVar7 == (gnode_t *)0x0) || (pgVar7->tag != NODE_KEYWORD_EXPR)) {
        bVar17 = false;
      }
      else {
        bVar17 = (pgVar7->token).type == TOK_KEY_SUPER;
      }
      if (node->list == (gnode_r *)0x0) {
        uVar15 = 0;
      }
      else {
        uVar15 = node->list->n;
      }
      if (uVar15 != 0) {
        _Var1 = (node->base).is_assignment;
        uVar12 = 0;
        do {
          if (uVar12 < node->list->n) {
            pgVar16 = (gnode_postfix_expr_t *)node->list->p[uVar12];
          }
          else {
            pgVar16 = (gnode_postfix_expr_t *)0x0;
          }
          gVar2 = (pgVar16->base).tag;
          uVar12 = uVar12 + 1;
          if ((uVar12 == uVar15) && (_Var1 != false)) {
            if (gVar2 == NODE_CALL_EXPR) {
              pcVar10 = "Unable to assign a value to a function call.";
              node = pgVar16;
              goto LAB_0011f704;
            }
            if (bVar17) {
              pcVar10 = "Unable to explicitly modify super.";
              node = pgVar16;
              goto LAB_0011f704;
            }
          }
          if (gVar2 == NODE_ACCESS_EXPR) {
            pgVar7 = pgVar16->id;
            if ((pgVar7 == (gnode_t *)0x0) || (pgVar7->tag != NODE_IDENTIFIER_EXPR)) {
              report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar7,"Invalid access expression.");
            }
          }
          else if (gVar2 == NODE_SUBSCRIPT_EXPR) {
            if (pgVar16->id != (gnode_t *)0x0) {
              gvisit(self,pgVar16->id);
            }
          }
          else {
            if (gVar2 != NODE_CALL_EXPR) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_semacheck2.c"
                            ,0x473,"void visit_postfix_expr(gvisitor_t *, gnode_postfix_expr_t *)");
            }
            pgVar7 = pgVar16->id;
            if (pgVar7 == (gnode_t *)0x0) {
              uVar14 = 0;
            }
            else {
              uVar14._0_4_ = pgVar7->tag;
              uVar14._4_4_ = pgVar7->refcount;
            }
            if (uVar14 != 0) {
              uVar11 = 0;
              do {
                pgVar7 = pgVar16->id;
                uVar4._0_4_ = pgVar7->tag;
                uVar4._4_4_ = pgVar7->refcount;
                if (uVar11 < uVar4) {
                  pgVar7 = *(gnode_t **)(*(long *)&pgVar7->token + uVar11 * 8);
                }
                else {
                  pgVar7 = (gnode_t *)0x0;
                }
                if ((pgVar7 == (gnode_t *)0x0) || (pgVar7->tag != NODE_BINARY_EXPR)) {
                  bVar18 = false;
                }
                else {
                  bVar18 = pgVar7[1].tag == 0x45;
                }
                if (bVar18) {
                  report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar7,
                               "Assignment does not have side effects and so cannot be used as function argument."
                              );
                  return;
                }
                gvisit(self,pgVar7);
                uVar11 = uVar11 + 1;
              } while (uVar14 != uVar11);
            }
          }
        } while (uVar12 != uVar15);
      }
      return;
    }
    if (node->list->n == 0) {
      node_01 = (gnode_postfix_expr_t *)0x0;
    }
    else {
      node_01 = (gnode_postfix_expr_t *)*node->list->p;
    }
    if ((node_01->base).tag == NODE_ACCESS_EXPR) {
      if ((node->base).is_assignment == true) {
        pcVar10 = "Assignment not allowed for an enum type.";
      }
      else {
        pgVar7 = node_01->id;
        if ((pgVar7 != (gnode_t *)0x0) && (pgVar7->tag == NODE_IDENTIFIER_EXPR)) {
          pcVar10 = *(char **)(pgVar7 + 1);
          pgVar7 = lookup_node(node_00,pcVar10);
          if (pgVar7 == (gnode_t *)0x0) {
            uVar5._0_4_ = node_00[1].token.colno;
            uVar5._4_4_ = node_00[1].token.position;
            report_error(self,GRAVITY_ERROR_SEMANTIC,&node_01->base,"Unable to find %s in enum %s.",
                         pcVar10,uVar5);
            return;
          }
          if ((node->list != (gnode_r *)0x0) && (node->list->n == 1)) {
            gnode_free(node->id);
            if (node->list->n == 0) {
              pgVar13 = (gnode_postfix_subexpr_t *)0x0;
            }
            else {
              pgVar13 = (gnode_postfix_subexpr_t *)*node->list->p;
            }
            free_postfix_subexpr(pgVar13);
            __ptr = node->list->p;
            if (__ptr != (gnode_t **)0x0) {
              free(__ptr);
            }
            free(node->list);
            node->list = (gnode_r *)0x0;
            pgVar7 = gnode_duplicate(pgVar7,false);
            node->id = pgVar7;
            return;
          }
          gnode_free(node->id);
          pgVar13 = (gnode_postfix_subexpr_t *)0x0;
          pgVar7 = gnode_duplicate(pgVar7,false);
          node->id = pgVar7;
          if (node->list->n != 0) {
            pgVar13 = (gnode_postfix_subexpr_t *)*node->list->p;
          }
          free_postfix_subexpr(pgVar13);
          pgVar9 = gnode_array_remove_byindex(node->list,0);
          node->list = pgVar9;
          return;
        }
        pcVar10 = "Invalid enum expression.";
        node = node_01;
      }
    }
    else {
      pcVar10 = "Invalid enum expression.";
      node = pgVar16;
    }
  }
LAB_0011f704:
  report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,pcVar10);
  return;
}

Assistant:

static void visit_postfix_expr (gvisitor_t *self, gnode_postfix_expr_t *node) {
    DEBUG_CODEGEN("visit_postfix_expr");

    // node->list usually cannot be NULL, it is NULL only as a result of a static enum transformation (see semacheck2.c)
    if (node->list == NULL) {
        visit(node->id);
        return;
    }

    DECLARE_CODE();
    CODEGEN_COUNT_REGISTERS(n1);
    ircode_push_context(code);

    // disable MOVE optimization
	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));

    // generate code for the common id node
    visit(node->id);

    bool is_super = IS_SUPER(node->id);

    // register that contains callable object
    uint32_t target_register = ircode_register_pop_context_protect(code, true);
    if (target_register == REGISTER_ERROR) {
        report_error(self, (gnode_t *)node->id, "Invalid postfix expression.");
        return;
    }

    // register where to store final result
    uint32_t dest_register = target_register;

    // mandatory self register (initialized to 0 in case of implicit self or explicit super)
    uint32_r self_list; marray_init(self_list);
    uint32_t first_self_register = compute_self_register(self, code, node->id, target_register, node->list);
    if (first_self_register == UINT32_MAX) return;
    marray_push(uint32_t, self_list, first_self_register);

    // process each subnode and set is_assignment flag
    bool is_assignment = node->base.is_assignment;
    size_t count = gnode_array_size(node->list);

    for (size_t i=0; i<count; ++i) {
        // a subnode can be a CALL_EXPR     => id.()
        // a NODE_ACCESS_EXPR               => id.id2
        // a NODE_SUBSCRIPT_EXPR            => id[]
        // or ANY combination of the them!  => id.id2.id3()[24]().id5()
        gnode_postfix_subexpr_t *subnode = (gnode_postfix_subexpr_t *)gnode_array_get(node->list, i);

        // identify postfix type: NODE_CALL_EXPR, NODE_ACCESS_EXPR, NODE_SUBSCRIPT_EXPR
        gnode_n tag = subnode->base.tag;

        // check assignment flag
        bool is_real_assigment = (is_assignment && IS_LAST_LOOP(i, count));

        if (tag == NODE_CALL_EXPR) {
            // a CALL instruction needs to properly prepare stack before execution
            // format is CALL A B C

            // where A is the destination register
            // B is the callable object
            // and C is the number of arguments passed to the CALL
            // arguments must be on the stack (so gravity VM can use a register window in order to speed up instruction)
            // and are expected to be starting from B+1

            // check dest register
            bool dest_is_temp = ircode_register_istemp(code, dest_register);
            if (!dest_is_temp) {
                dest_register = ircode_register_push_temp(code);
                dest_is_temp = true;
            }

            // add target register (must be temp)
            uint32_t temp_target_register = ircode_register_push_temp(code);
			ircode_add(code, MOVE, temp_target_register, target_register, 0, LINE_NUMBER(node));
            uint32_t treg = ircode_register_pop_context_protect(code, true);
            if (treg == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode, "Unexpected register error.");
                return;
            }

            // always add SELF parameter (must be temp+1)
            uint32_t self_register = marray_pop(self_list);
            uint32_t temp_self_register = ircode_register_push_temp(code);
			ircode_add(code, MOVE, temp_self_register, self_register, 0, LINE_NUMBER(node));
            treg = ircode_register_pop_context_protect(code, true);
            if (treg == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode, "Unexpected register error.");
                return;
            }

            // process each parameter (each must be temp+2 ... temp+n)
            marray_decl_init(uint32_r, args);
            size_t n = gnode_array_size(subnode->args);
            for (size_t j=0; j<n; ++j) {
                // process each argument
                gnode_t *arg = (gnode_t *)gnode_array_get(subnode->args, j);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
                visit(arg);
				ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
                uint32_t nreg = ircode_register_pop_context_protect(code, true);
                if (nreg == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)arg, "Invalid argument expression at index %d.", j+1);
                    return;
                }

                // make sure args are in consecutive register locations (from temp_target_register + 1 to temp_target_register + n)
                if (nreg != temp_target_register + j + 2) {
                    uint32_t temp = ircode_register_push_temp(code);
                    if (temp == 0) return; // temp value == 0 means codegen error (error will be automatically reported later in visit_function_decl
					ircode_add(code, MOVE, temp, nreg, 0, LINE_NUMBER(node));
                    ircode_register_clear(code, nreg);
                    nreg = ircode_register_pop_context_protect(code, true);
                    if (nreg == REGISTER_ERROR) {
                        report_error(self, (gnode_t *)arg, "Invalid argument expression");
                        return;
                    }
                }
                if (nreg != temp_target_register + j + 2) {
                    report_error(self, (gnode_t *)arg, "Invalid register computation in call expression.");
                    return;
                }
                
                // a checkpoint should be added after each nreg computation in order to support STRUCT
                // I'll skip this overhead in this version because it should be a type based decision
                // ircode_add_check(code, nreg);
                marray_push(uint32_t, args, nreg);
            }

            // generate instruction CALL with count parameters (taking in account self)
			ircode_add(code, CALL, dest_register, temp_target_register, (uint32_t)n+1, LINE_NUMBER(node));

            // cleanup temp registers
            ircode_register_clear(code, temp_target_register);
            ircode_register_clear(code, temp_self_register);
            n = gnode_array_size(subnode->args);
            for (size_t j=0; j<n; ++j) {
                uint32_t reg = marray_get(args, j);
                ircode_register_clear(code, reg);
            }

            // update self list
            marray_push(uint32_t, self_list, dest_register);

            // a call returns a value
            if (IS_LAST_LOOP(i, count)) {
                if (ircode_register_count(code)) {
                    // code added in order to protect the extra register pushed in case
                    // of code like: f(20)(30)
                    uint32_t last_register = ircode_register_last(code);
                    if (last_register == REGISTER_ERROR) {
                        report_error(self, (gnode_t *)subnode, "Invalid call expression.");
                        return;
                    }
                    if (dest_is_temp && last_register == dest_register) dest_is_temp = false;
                }
                if (dest_is_temp) ircode_register_push(code, dest_register);
                if (!ircode_register_protect_outside_context(code, dest_register)) {
                    report_error(self, (gnode_t *)subnode, "Invalid register access.");
                    return;
                }
            }

            // free temp args array
            marray_destroy(args);

        } else if (tag == NODE_ACCESS_EXPR) {
            // process identifier node (semantic check assures that each node is an identifier)
            gnode_identifier_expr_t *expr = (gnode_identifier_expr_t *)subnode->expr;
            uint32_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, expr->value));
            uint32_t index_register = ircode_register_push_temp(code);
			ircode_add(code, LOADK, index_register, index, 0, LINE_NUMBER(expr));
            uint32_t temp = ircode_register_pop(code);
            if (temp == REGISTER_ERROR) {
                report_error(self, (gnode_t *)expr, "Invalid access expression.");
                return;
            }

            // generate LOAD/STORE instruction
            dest_register = (is_real_assigment) ? ircode_register_pop(code) : ircode_register_push_temp(code);
            if (dest_register == REGISTER_ERROR) {
                report_error(self, (gnode_t *)expr, "Invalid access expression.");
                return;
            }

            if (is_super) {
                gravity_class_t *class = context_get_class(self);
                if (!class) {
                    report_error(self, (gnode_t *)node, "Unable to use super keyword in a non class context.");
                    return;
                }
                
                // check if class has a superclass not yet processed
                const char *identifier = lookup_superclass_identifier (self, class);
                if (!identifier) {
                    // it means that class superclass has already been processed
                    class = class->superclass;
                    identifier = (class) ? class->identifier : GRAVITY_CLASS_OBJECT_NAME;
                }
                
                uint32_t cpool_index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
                ircode_add_constant(code, cpool_index, LINE_NUMBER(node));
                uint32_t temp_reg = ircode_register_pop(code);
                ircode_add(code, LOADS, dest_register, temp_reg, index_register, LINE_NUMBER(node));
            } else {
                ircode_add(code, (is_real_assigment) ? STORE : LOAD, dest_register, target_register, index_register, LINE_NUMBER(node));
            }
            
            if (!is_real_assigment) {
                if (i+1<count) {
                uint32_t rtemp = ircode_register_pop_context_protect(code, true);
                if (rtemp == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)expr, "Unexpected register error.");
                    return;
                }
                } else {
                    // last loop
                    if (ircode_register_istemp(code, dest_register))
                        ircode_register_protect_outside_context(code, dest_register);
                }
            }

            // update self list (if latest instruction)
            // this was added in order to properly emit instructions for nested_class.gravity unit test
            if (!IS_LAST_LOOP(i, count)) {
                gnode_postfix_subexpr_t *nextnode = (gnode_postfix_subexpr_t *)gnode_array_get(node->list, i+1);
                if (nextnode->base.tag != NODE_CALL_EXPR) marray_push(uint32_t, self_list, dest_register);
            }

        } else if (tag == NODE_SUBSCRIPT_EXPR) {
            // process index
			ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
            visit(subnode->expr);
			ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 0, LINE_NUMBER(node));
            uint32_t index = ircode_register_pop(code);
            if (index == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode->expr, "Invalid subscript expression.");
                return;
            }

            // generate LOADAT/STOREAT instruction
            dest_register = (is_real_assigment) ? ircode_register_pop(code) : ircode_register_push_temp(code);
            if (dest_register == REGISTER_ERROR) {
                report_error(self, (gnode_t *)subnode->expr, "Invalid subscript expression.");
                return;
            }
			ircode_add(code, (is_real_assigment) ? STOREAT : LOADAT, dest_register, target_register, index, LINE_NUMBER(node));
            if ((!is_real_assigment) && (i+1<count)) {
                uint32_t rtemp = ircode_register_pop_context_protect(code, true);
                if (rtemp == REGISTER_ERROR) {
                    report_error(self, (gnode_t *)subnode->expr, "Unexpected register error.");
                    return;
                }
                marray_push(uint32_t, self_list, rtemp);
            }
        }

        // reset is_super flag
        is_super = false;

        // update target
        target_register = dest_register;
    }

    marray_destroy(self_list);
    ircode_pop_context(code);

    // temp fix for not optimal register allocation algorithm generated code
    uint32_t temp_register = ircode_register_first_temp_available(code);
    if (temp_register < dest_register) {
        // free dest register
        ircode_register_pop(code);
        // allocate a new register (that I am now sure does not have holes)
        temp_register = ircode_register_push_temp(code);
        ircode_add(code, MOVE, temp_register, dest_register, 0, LINE_NUMBER(node));
        ircode_register_clear(code, dest_register);
    }
    
    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);

    // re-enable MOVE optimization
	ircode_pragma(code, PRAGMA_MOVE_OPTIMIZATION, 1, LINE_NUMBER(node));
}